

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::mulF32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  Literal *this_01;
  long lVar1;
  undefined1 local_120 [8];
  LaneArray<4> other_lanes;
  LaneArray<4> lanes;
  Literal local_48;
  
  getLanesF32x4((LaneArray<4> *)&other_lanes._M_elems[3].type,this);
  getLanesF32x4((LaneArray<4> *)local_120,other);
  this_00 = &lanes._M_elems[3].type;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1);
    mul(&local_48,this_01,(Literal *)(local_120 + lVar1));
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)&other_lanes._M_elems[3].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_120);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&other_lanes._M_elems[3].type)
  ;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::mulF32x4(const Literal& other) const {
  return binary<4, &Literal::getLanesF32x4, &Literal::mul>(*this, other);
}